

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<int> **pdescriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  code *pcVar1;
  BigPropertyIndex propIndex;
  Type this_00;
  PropertyRecord *pPVar2;
  bool bVar3;
  PropertyAttributes attributes;
  byte bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar8;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  ScriptContext *pSVar9;
  Var pvVar10;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_03;
  bool local_9a;
  bool local_99;
  RuntimeFunction *local_88;
  undefined1 local_78 [20];
  int dataSlot;
  RecyclableObject *func;
  ScriptContext *scriptContext;
  Type TStack_50;
  int dataSlotAllowLetConstGlobal;
  DynamicObject *localSingletonInstance;
  Type TStack_40;
  PropertyId propertyId;
  DictionaryPropertyDescriptor<int> *descriptor;
  Type TStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  DictionaryPropertyDescriptor<int> **pdescriptor_local;
  PropertyRecord *propertyRecord_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor._4_4_ = flags;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local = pdescriptor;
  pdescriptor_local = (DictionaryPropertyDescriptor<int> **)propertyRecord;
  propertyRecord_local = (PropertyRecord *)instance;
  instance_local = (DynamicObject *)this;
  if ((pdescriptor == (DictionaryPropertyDescriptor<int> **)0x0) ||
     (*pdescriptor == (DictionaryPropertyDescriptor<int> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  TStack_40.ptr = *value_local;
  localSingletonInstance._4_4_ = PropertyRecord::GetPropertyId((PropertyRecord *)pdescriptor_local);
  if (propertyRecord_local == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((((ulong)((TStack_40.ptr)->super_JavascriptFunction).super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject & 0x800) != 0) &&
     (bVar3 = DictionaryPropertyDescriptor<int>::GetIsShadowed
                        ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->singletonInstance);
  if (*ppRVar8 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    local_88 = (RuntimeFunction *)0x0;
  }
  else {
    this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&this->singletonInstance);
    local_88 = (RuntimeFunction *)Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01);
  }
  TStack_50.ptr = local_88;
  ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->singletonInstance);
  if ((*ppRVar8 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     (TStack_50.ptr != (RuntimeFunction *)propertyRecord_local)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ed,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  scriptContext._4_4_ =
       DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>
                 ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
  if (scriptContext._4_4_ == -1) {
    iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                      ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
    pPVar2 = propertyRecord_local;
    if (iVar6 != -1) {
      iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
      pvVar10 = DynamicObject::GetSlot((DynamicObject *)pPVar2,iVar6);
      register0x00000000 = (RuntimeFunction *)VarTo<Js::RecyclableObject>(pvVar10);
      Js::JavascriptOperators::CallSetter
                ((RecyclableObject *)register0x00000000,propertyRecord_local,TStack_30.ptr,
                 (ScriptContext *)0x0);
      this_02 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&this->propertyMap);
      bVar3 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this_02,(PropertyRecord **)&pdescriptor_local,
                         (DictionaryPropertyDescriptor<int> **)value_local);
      if (bVar3) {
        TStack_40.ptr = *value_local;
        local_78._12_4_ =
             DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                       ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
        if (local_78._12_4_ == -1) {
          iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                            ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
          pPVar2 = propertyRecord_local;
          if (iVar6 != -1) {
            iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                              ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
            SetPropertyValueInfoNonFixed
                      (this,info,(RecyclableObject *)pPVar2,iVar6,
                       *(PropertyAttributes *)
                        ((long)&((TStack_40.ptr)->super_JavascriptFunction).super_DynamicObject.
                                super_RecyclableObject.super_FinalizableObject.
                                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1),
                       InlineCacheSetterFlag);
          }
        }
        else {
          SetPropertyValueInfoNonFixed
                    (this,info,(RecyclableObject *)propertyRecord_local,local_78._12_4_,
                     *(PropertyAttributes *)
                      ((long)&((TStack_40.ptr)->super_JavascriptFunction).super_DynamicObject.
                              super_RecyclableObject.super_FinalizableObject.
                              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1),
                     InlineCacheNoFlags);
        }
      }
      else {
        *(undefined8 *)value_local = 0;
      }
    }
  }
  else {
    if ((((ulong)((TStack_40.ptr)->super_JavascriptFunction).super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject & 0xc000) != 0) &&
       ((descriptor._4_4_ & PropertyOperation_AllowUndecl) == PropertyOperation_None)) {
      pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)propertyRecord_local);
      func = (RecyclableObject *)pSVar9;
      pvVar10 = DynamicObject::GetSlot((DynamicObject *)propertyRecord_local,scriptContext._4_4_);
      bVar3 = ScriptContext::IsUndeclBlockVar(pSVar9,pvVar10);
      if (bVar3) {
        JavascriptError::ThrowReferenceError((ScriptContext *)func,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
    bVar3 = DictionaryPropertyDescriptor<int>::GetIsInitialized
                      ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
    if (bVar3) {
      InvalidateFixedField<int>
                (this,(DynamicObject *)propertyRecord_local,localSingletonInstance._4_4_,
                 (DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
    }
    else if (((((descriptor._4_4_ & PropertyOperation_PreInit) == PropertyOperation_None) &&
              (DictionaryPropertyDescriptor<int>::SetIsInitialized
                         ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr,true),
              TStack_50.ptr == (RuntimeFunction *)propertyRecord_local)) &&
             (BVar5 = IsInternalPropertyId(localSingletonInstance._4_4_), BVar5 == 0)) &&
            ((descriptor._4_4_ & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue))
             == PropertyOperation_None)) {
      if (TStack_30.ptr == (RuntimeFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x305,"(value != nullptr)","value != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      BVar5 = RecyclableObject::IsExternal((RecyclableObject *)propertyRecord_local);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this_00.ptr = TStack_40.ptr;
      bVar3 = VarIs<Js::JavascriptFunction>(TStack_30.ptr);
      if (bVar3) {
        local_99 = DynamicTypeHandler::ShouldFixMethodProperties();
      }
      else {
        bVar3 = DynamicTypeHandler::ShouldFixDataProperties();
        local_9a = false;
        if (bVar3) {
          local_9a = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                               ((DynamicObject *)propertyRecord_local,localSingletonInstance._4_4_,
                                TStack_30.ptr);
        }
        local_99 = local_9a;
      }
      DictionaryPropertyDescriptor<int>::SetIsFixed
                ((DictionaryPropertyDescriptor<int> *)this_00.ptr,local_99);
    }
    DynamicTypeHandler::SetSlotUnchecked
              ((DynamicObject *)propertyRecord_local,scriptContext._4_4_,TStack_30.ptr);
    bVar3 = DictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed
                      ((DictionaryPropertyDescriptor<int> *)TStack_40.ptr);
    pPVar2 = propertyRecord_local;
    propIndex = scriptContext._4_4_;
    if (bVar3) {
      PropertyValueInfo::SetNoCache(info,(RecyclableObject *)propertyRecord_local);
    }
    else {
      attributes = GetLetConstGlobalPropertyAttributes<true>
                             (*(PropertyAttributes *)
                               ((long)&((TStack_40.ptr)->super_JavascriptFunction).
                                       super_DynamicObject.super_RecyclableObject.
                                       super_FinalizableObject.super_IRecyclerVisitedObject.
                                       _vptr_IRecyclerVisitedObject + 1));
      SetPropertyValueInfoNonFixed
                (this,info,(RecyclableObject *)pPVar2,propIndex,attributes,InlineCacheNoFlags);
    }
  }
  bVar3 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(localSingletonInstance._4_4_);
  if (bVar3) {
    DynamicTypeHandler::SetHasSpecialProperties(&this->super_DynamicTypeHandler);
    bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    if ((bVar4 & 0x20) != 0) {
      pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)propertyRecord_local);
      ScriptContext::GetLibrary(pSVar9);
      JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_78)
      ;
      this_03 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                           local_78);
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this_03);
    }
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,(DynamicObject *)propertyRecord_local,
             localSingletonInstance._4_4_,TStack_30.ptr,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }